

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaShow.c
# Opt level: O1

int Gia_ShowAddOut(Vec_Int_t *vAdds,Vec_Int_t *vMapAdds,int Node)

{
  uint uVar1;
  
  if ((-1 < Node) && (Node < vMapAdds->nSize)) {
    uVar1 = vMapAdds->pArray[(uint)Node];
    if (-1 < (int)uVar1) {
      if (vAdds->nSize <= (int)(uVar1 * 6 + 4)) goto LAB_007b0857;
      Node = vAdds->pArray[(ulong)uVar1 * 6 + 4];
    }
    return Node;
  }
LAB_007b0857:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

int Gia_ShowAddOut( Vec_Int_t * vAdds, Vec_Int_t * vMapAdds, int Node )
{
    int iBox = Vec_IntEntry( vMapAdds, Node );
    if ( iBox >= 0 )
        return Vec_IntEntry( vAdds, 6*iBox+4 );
    return Node;
}